

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O3

void __thiscall
TEST_MemoryLeakWarningGlobalDetectorTest_gettingTheGlobalDetectorDoesNotRestoreTheMemoryLeakOverloadsWhenTheyWereAlreadyOff_Test
::testBody(TEST_MemoryLeakWarningGlobalDetectorTest_gettingTheGlobalDetectorDoesNotRestoreTheMemoryLeakOverloadsWhenTheyWereAlreadyOff_Test
           *this)

{
  bool bVar1;
  MemoryLeakDetector *pMVar2;
  MemoryLeakFailure *pMVar3;
  UtestShell *pUVar4;
  TestTerminator *pTVar5;
  
  MemoryLeakWarningPlugin::setGlobalDetector((MemoryLeakDetector *)0x0,(MemoryLeakFailure *)0x0);
  pMVar2 = MemoryLeakWarningPlugin::getGlobalDetector();
  pMVar3 = MemoryLeakWarningPlugin::getGlobalFailureReporter();
  MemoryLeakWarningPlugin::saveAndDisableNewDeleteOverloads();
  bVar1 = MemoryLeakWarningPlugin::areNewDeleteOverloaded();
  MemoryLeakWarningPlugin::restoreNewDeleteOverloads();
  pUVar4 = UtestShell::getCurrent();
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)!bVar1,"CHECK","!areNewDeleteOverloaded",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
             ,0x143,pTVar5);
  if (pMVar3 != (MemoryLeakFailure *)0x0) {
    (*pMVar3->_vptr_MemoryLeakFailure[1])();
  }
  if (pMVar2 != (MemoryLeakDetector *)0x0) {
    (*pMVar2->_vptr_MemoryLeakDetector[1])();
  }
  MemoryLeakWarningPlugin::setGlobalDetector((MemoryLeakDetector *)0x0,(MemoryLeakFailure *)0x0);
  return;
}

Assistant:

TEST(MemoryLeakWarningGlobalDetectorTest, gettingTheGlobalDetectorDoesNotRestoreTheMemoryLeakOverloadsWhenTheyWereAlreadyOff)
{
    MemoryLeakWarningPlugin::setGlobalDetector(NULLPTR, NULLPTR);
    MemoryLeakDetector* temporaryDetector = MemoryLeakWarningPlugin::getGlobalDetector();
    MemoryLeakFailure*  temporaryReporter = MemoryLeakWarningPlugin::getGlobalFailureReporter();

    MemoryLeakWarningPlugin::saveAndDisableNewDeleteOverloads();

    bool areNewDeleteOverloaded = MemoryLeakWarningPlugin::areNewDeleteOverloaded();
    MemoryLeakWarningPlugin::restoreNewDeleteOverloads();

    CHECK(!areNewDeleteOverloaded);

    delete temporaryReporter;
    delete temporaryDetector;
    MemoryLeakWarningPlugin::setGlobalDetector(NULLPTR, NULLPTR);
}